

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown-tokens.cpp
# Opt level: O0

string * markdown::token::RawText::_processLinksImagesAndTags
                   (string *__return_storage_ptr__,string *src,ReplacementTable *replacements,
                   LinkIds *idTable)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  const_reference pvVar5;
  difference_type dVar6;
  ulong uVar7;
  pointer_type pTVar8;
  RawText *pRVar9;
  Image *this;
  HtmlAnchorTag *pHVar10;
  HtmlTag *pHVar11;
  Container *pCVar12;
  size_t sVar13;
  unsigned_long *arg;
  unsigned_long *arg_00;
  int local_718;
  allocator<char> local_711;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_710;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_708;
  string local_700 [39];
  undefined1 local_6d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  shared_ptr<markdown::Token> local_6b8;
  undefined1 local_6a1;
  string local_6a0;
  shared_ptr<markdown::Token> local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  shared_ptr<markdown::Token> local_650;
  undefined1 local_63a;
  allocator<char> local_639;
  string local_638;
  shared_ptr<markdown::Token> local_618;
  undefined1 local_601;
  string local_600;
  shared_ptr<markdown::Token> local_5e0;
  undefined1 local_5c9;
  string local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  string local_588;
  shared_ptr<markdown::Token> local_568;
  undefined1 local_558 [8];
  TokenGroup subgroup_1;
  allocator<char> local_529;
  string local_528;
  shared_ptr<markdown::Token> local_508;
  shared_ptr<markdown::Token> local_4f8;
  undefined1 local_4e1;
  string local_4e0;
  shared_ptr<markdown::Token> local_4c0;
  undefined1 local_4b0 [8];
  TokenGroup subgroup;
  string contents;
  string local_470;
  shared_ptr<markdown::Token> local_450;
  size_type local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  shared_ptr<markdown::Token> local_3d8;
  shared_ptr<markdown::Token> local_3c8;
  undefined1 local_3b2;
  allocator<char> local_3b1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a8;
  string local_3a0;
  shared_ptr<markdown::Token> local_380;
  char *local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_301;
  undefined1 local_300 [8];
  smatch mm;
  string urlAndTitle;
  undefined1 local_270 [8];
  optional<markdown::LinkIds::Target> target;
  undefined1 local_208 [8];
  string linkId;
  undefined1 local_1c0 [7];
  bool resolved;
  string title;
  string url;
  string contentsOrAlttext;
  bool isReference;
  bool isLink;
  size_type sStack_158;
  bool isImage;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  allocator<char> local_e9;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  string local_d8 [40];
  char *local_b0;
  allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a1;
  undefined1 local_a0 [8];
  smatch m;
  const_iterator end;
  const_iterator prev;
  LinkIds *idTable_local;
  ReplacementTable *replacements_local;
  string *src_local;
  string *tgt;
  
  if ((_processLinksImagesAndTags(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&,markdown::LinkIds_const&)
       ::cExpression == '\0') &&
     (iVar4 = __cxa_guard_acquire(&_processLinksImagesAndTags(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&,markdown::LinkIds_const&)
                                   ::cExpression), iVar4 != 0)) {
    boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
    basic_regex(&_processLinksImagesAndTags::cExpression,
                "(?:(!?)\\[([^\\]]+?)\\] *\\(([^\\(]*(?:\\(.*?\\).*?)*?)\\))|(?:(!?)\\[((?:[^]]*?\\[.*?\\].*?)|(?:.+?))\\](?: *\\[(.*?)\\])?)|(?:<(/?([a-zA-Z0-9]+).*?)>)"
                ,0);
    __cxa_atexit(boost::
                 basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
                 ~basic_regex,&_processLinksImagesAndTags::cExpression,&__dso_handle);
    __cxa_guard_release(&_processLinksImagesAndTags(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&,markdown::LinkIds_const&)
                         ::cExpression);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  end._M_current = (char *)std::__cxx11::string::begin();
  m._72_8_ = std::__cxx11::string::end();
  do {
    std::
    allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::allocator(&local_a1);
    boost::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)local_a0,&local_a1);
    std::
    allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~allocator(&local_a1);
    local_b0 = end._M_current;
    local_d8._32_8_ = m._72_8_;
    bVar2 = boost::
            regex_search<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )end._M_current,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )m._72_8_,
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_a0,&_processLinksImagesAndTags::cExpression,format_default);
    if (bVar2) {
      pvVar5 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)local_a0,0);
      if ((pvVar5->matched & 1U) == 0) {
        __assert_fail("m[0].matched",
                      "/workspace/llm4binary/github/license_c_cmakelists/sevenjay[P]cpp-markdown/src/markdown-tokens.cpp"
                      ,0x17d,
                      "static std::string markdown::token::RawText::_processLinksImagesAndTags(const std::string &, ReplacementTable &, const LinkIds &)"
                     );
      }
      pvVar5 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)local_a0,0);
      dVar6 = boost::
              sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::length(pvVar5);
      if (dVar6 == 0) {
        __assert_fail("m[0].length()!=0",
                      "/workspace/llm4binary/github/license_c_cmakelists/sevenjay[P]cpp-markdown/src/markdown-tokens.cpp"
                      ,0x17e,
                      "static std::string markdown::token::RawText::_processLinksImagesAndTags(const std::string &, ReplacementTable &, const LinkIds &)"
                     );
      }
      local_e0._M_current = end._M_current;
      pvVar5 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)local_a0,0);
      local_e8._M_current =
           (pvVar5->
           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).first._M_current;
      std::allocator<char>::allocator();
      std::__cxx11::string::
      string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                (local_d8,local_e0,local_e8,&local_e9);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_d8);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator(&local_e9);
      sStack_158 = std::
                   vector<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                   ::size(replacements);
      boost::lexical_cast<std::__cxx11::string,unsigned_long>
                (&local_150,(boost *)&stack0xfffffffffffffea8,arg);
      std::operator+(&local_130,"\x01@",&local_150);
      std::operator+(&local_110,&local_130,"@links&Images1\x01");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      pvVar5 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)local_a0,0);
      end._M_current =
           (pvVar5->
           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).second._M_current;
      bVar1 = false;
      bVar2 = false;
      bVar3 = false;
      pvVar5 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)local_a0,4);
      if ((pvVar5->matched & 1U) == 0) {
LAB_001c243b:
        pvVar5 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)local_a0,1);
        if ((pvVar5->matched & 1U) != 0) {
          pvVar5 = boost::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)local_a0,1);
          dVar6 = boost::
                  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::length(pvVar5);
          if (dVar6 != 0) {
            bVar1 = true;
            goto LAB_001c2512;
          }
        }
        pvVar5 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)local_a0,5);
        if ((pvVar5->matched & 1U) == 0) {
          pvVar5 = boost::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)local_a0,2);
          bVar2 = (pvVar5->matched & 1U) != 0;
        }
        else {
          bVar3 = true;
          bVar2 = true;
        }
      }
      else {
        pvVar5 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)local_a0,4);
        dVar6 = boost::
                sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::length(pvVar5);
        if (dVar6 == 0) goto LAB_001c243b;
        bVar3 = true;
        bVar1 = true;
      }
LAB_001c2512:
      if ((bVar1) || (bVar2)) {
        std::__cxx11::string::string((string *)(url.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(title.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)local_1c0);
        bVar2 = false;
        if (bVar3) {
          pvVar5 = boost::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)local_a0,5);
          boost::sub_match::operator_cast_to_string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&linkId.field_2 + 8),(sub_match *)pvVar5);
          std::__cxx11::string::operator=
                    ((string *)(url.field_2._M_local_buf + 8),
                     (string *)(linkId.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(linkId.field_2._M_local_buf + 8));
          pvVar5 = boost::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)local_a0,6);
          if ((pvVar5->matched & 1U) == 0) {
            std::__cxx11::string::string((string *)local_208);
          }
          else {
            pvVar5 = boost::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)local_a0,6);
            boost::sub_match::operator_cast_to_string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_208,(sub_match *)pvVar5);
          }
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) != 0) {
            anon_unknown_0::cleanTextLinkRef
                      ((string *)((long)&target.super_type.m_storage.dummy_ + 0x38),
                       (string *)((long)&url.field_2 + 8));
            std::__cxx11::string::operator=
                      ((string *)local_208,
                       (string *)(target.super_type.m_storage.dummy_.data + 0x38));
            std::__cxx11::string::~string
                      ((string *)(target.super_type.m_storage.dummy_.data + 0x38));
          }
          LinkIds::find((optional<markdown::LinkIds::Target> *)local_270,idTable,(string *)local_208
                       );
          bVar2 = boost::optional<markdown::LinkIds::Target>::operator!
                            ((optional<markdown::LinkIds::Target> *)local_270);
          bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
          if (bVar2) {
            pTVar8 = boost::optional<markdown::LinkIds::Target>::operator->
                               ((optional<markdown::LinkIds::Target> *)local_270);
            std::__cxx11::string::operator=
                      ((string *)(title.field_2._M_local_buf + 8),(string *)pTVar8);
            pTVar8 = boost::optional<markdown::LinkIds::Target>::operator->
                               ((optional<markdown::LinkIds::Target> *)local_270);
            std::__cxx11::string::operator=((string *)local_1c0,(string *)&pTVar8->title);
          }
          boost::optional<markdown::LinkIds::Target>::~optional
                    ((optional<markdown::LinkIds::Target> *)local_270);
          std::__cxx11::string::~string((string *)local_208);
        }
        else {
          if ((_processLinksImagesAndTags(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&,markdown::LinkIds_const&)
               ::cReference == '\0') &&
             (iVar4 = __cxa_guard_acquire(&_processLinksImagesAndTags(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&,markdown::LinkIds_const&)
                                           ::cReference), iVar4 != 0)) {
            boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
            basic_regex(&_processLinksImagesAndTags::cReference,
                        "^<?([^ >]*)>?(?: *(?:(\'|\")(.*)\\2)|(?:\\((.*)\\)))? *$",0);
            __cxa_atexit(boost::
                         basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                         ::~basic_regex,&_processLinksImagesAndTags::cReference,&__dso_handle);
            __cxa_guard_release(&_processLinksImagesAndTags(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&,markdown::LinkIds_const&)
                                 ::cReference);
          }
          pvVar5 = boost::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)local_a0,2);
          boost::sub_match::operator_cast_to_string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&urlAndTitle.field_2 + 8),(sub_match *)pvVar5);
          std::__cxx11::string::operator=
                    ((string *)(url.field_2._M_local_buf + 8),
                     (string *)(urlAndTitle.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(urlAndTitle.field_2._M_local_buf + 8));
          pvVar5 = boost::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)local_a0,3);
          boost::sub_match::operator_cast_to_string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &mm.m_last_closed_paren,(sub_match *)pvVar5);
          std::
          allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::allocator(&local_301);
          boost::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_300,&local_301);
          std::
          allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~allocator(&local_301);
          bVar3 = boost::
                  regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &mm.m_last_closed_paren,
                             (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)local_300,&_processLinksImagesAndTags::cReference,format_default);
          if (bVar3) {
            pvVar5 = boost::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)local_300,1);
            boost::sub_match::operator_cast_to_string(&local_328,(sub_match *)pvVar5);
            std::__cxx11::string::operator=
                      ((string *)(title.field_2._M_local_buf + 8),(string *)&local_328);
            std::__cxx11::string::~string((string *)&local_328);
            pvVar5 = boost::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)local_300,3);
            if ((pvVar5->matched & 1U) == 0) {
              pvVar5 = boost::
                       match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)local_300,4);
              if ((pvVar5->matched & 1U) != 0) {
                pvVar5 = boost::
                         match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       *)local_300,4);
                boost::sub_match::operator_cast_to_string(&local_368,(sub_match *)pvVar5);
                std::__cxx11::string::operator=((string *)local_1c0,(string *)&local_368);
                std::__cxx11::string::~string((string *)&local_368);
              }
            }
            else {
              pvVar5 = boost::
                       match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)local_300,3);
              boost::sub_match::operator_cast_to_string(&local_348,(sub_match *)pvVar5);
              std::__cxx11::string::operator=((string *)local_1c0,(string *)&local_348);
              std::__cxx11::string::~string((string *)&local_348);
            }
            bVar2 = true;
          }
          boost::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)local_300);
          std::__cxx11::string::~string((string *)&mm.m_last_closed_paren);
        }
        if (bVar2) {
          if (bVar1) {
            this = (Image *)operator_new(0x68);
            Image::Image(this,(string *)((long)&url.field_2 + 8),
                         (string *)((long)&title.field_2 + 8),(string *)local_1c0);
            boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::Image>(&local_3c8,this);
            std::
            vector<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
            ::push_back(replacements,&local_3c8);
            boost::shared_ptr<markdown::Token>::~shared_ptr(&local_3c8);
          }
          else {
            pHVar10 = (HtmlAnchorTag *)operator_new(0x30);
            HtmlAnchorTag::HtmlAnchorTag
                      (pHVar10,(string *)((long)&title.field_2 + 8),(string *)local_1c0);
            boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlAnchorTag>
                      (&local_3d8,pHVar10);
            std::
            vector<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
            ::push_back(replacements,&local_3d8);
            boost::shared_ptr<markdown::Token>::~shared_ptr(&local_3d8);
            std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,(string *)(url.field_2._M_local_buf + 8));
            local_440 = std::
                        vector<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                        ::size(replacements);
            boost::lexical_cast<std::__cxx11::string,unsigned_long>
                      (&local_438,(boost *)&local_440,arg_00);
            std::operator+(&local_418,"\x01@",&local_438);
            std::operator+(&local_3f8,&local_418,"@links&Images2\x01");
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_3f8);
            std::__cxx11::string::~string((string *)&local_3f8);
            std::__cxx11::string::~string((string *)&local_418);
            std::__cxx11::string::~string((string *)&local_438);
            pHVar11 = (HtmlTag *)operator_new(0x30);
            contents.field_2._M_local_buf[0xe] = '\x01';
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_470,"/a",
                       (allocator<char> *)(contents.field_2._M_local_buf + 0xf));
            HtmlTag::HtmlTag(pHVar11,&local_470);
            contents.field_2._M_local_buf[0xe] = '\0';
            boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlTag>
                      (&local_450,pHVar11);
            std::
            vector<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
            ::push_back(replacements,&local_450);
            boost::shared_ptr<markdown::Token>::~shared_ptr(&local_450);
            std::__cxx11::string::~string((string *)&local_470);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(contents.field_2._M_local_buf + 0xf));
          }
        }
        else {
          pvVar5 = boost::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)local_a0,0);
          end._M_current =
               (char *)__gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)pvVar5,1);
          local_370 = end._M_current;
          pRVar9 = (RawText *)operator_new(0x30);
          local_3b2 = 1;
          pvVar5 = boost::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)local_a0,0);
          local_3a8._M_current =
               (pvVar5->
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).first._M_current;
          local_3b0 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )end._M_current;
          std::allocator<char>::allocator();
          std::__cxx11::string::
          string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                    ((string *)&local_3a0,local_3a8,local_3b0,&local_3b1);
          RawText(pRVar9,&local_3a0,true);
          local_3b2 = 0;
          boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::RawText>
                    (&local_380,pRVar9);
          std::
          vector<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
          ::push_back(replacements,&local_380);
          boost::shared_ptr<markdown::Token>::~shared_ptr(&local_380);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::allocator<char>::~allocator(&local_3b1);
        }
        std::__cxx11::string::~string((string *)local_1c0);
        std::__cxx11::string::~string((string *)(title.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(url.field_2._M_local_buf + 8));
      }
      else {
        pvVar5 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)local_a0,7);
        boost::sub_match::operator_cast_to_string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &subgroup.
                    super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                    ._M_impl._M_node._M_size,(sub_match *)pvVar5);
        bVar2 = anon_unknown_0::looksLikeUrl
                          ((string *)
                           &subgroup.
                            super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                            ._M_impl._M_node._M_size);
        if (bVar2) {
          std::__cxx11::
          list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
          ::list((list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                  *)local_4b0);
          pHVar10 = (HtmlAnchorTag *)operator_new(0x30);
          local_4e1 = 1;
          std::__cxx11::string::string((string *)&local_4e0);
          HtmlAnchorTag::HtmlAnchorTag
                    (pHVar10,(string *)
                             &subgroup.
                              super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                              ._M_impl._M_node._M_size,&local_4e0);
          local_4e1 = 0;
          boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlAnchorTag>
                    (&local_4c0,pHVar10);
          std::__cxx11::
          list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
          ::push_back((list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                       *)local_4b0,&local_4c0);
          boost::shared_ptr<markdown::Token>::~shared_ptr(&local_4c0);
          std::__cxx11::string::~string((string *)&local_4e0);
          pRVar9 = (RawText *)operator_new(0x30);
          RawText(pRVar9,(string *)
                         &subgroup.
                          super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                          ._M_impl._M_node._M_size,false);
          boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::RawText>
                    (&local_4f8,pRVar9);
          std::__cxx11::
          list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
          ::push_back((list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                       *)local_4b0,&local_4f8);
          boost::shared_ptr<markdown::Token>::~shared_ptr(&local_4f8);
          pHVar11 = (HtmlTag *)operator_new(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"/a",&local_529);
          HtmlTag::HtmlTag(pHVar11,&local_528);
          boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlTag>
                    (&local_508,pHVar11);
          std::__cxx11::
          list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
          ::push_back((list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                       *)local_4b0,&local_508);
          boost::shared_ptr<markdown::Token>::~shared_ptr(&local_508);
          std::__cxx11::string::~string((string *)&local_528);
          std::allocator<char>::~allocator(&local_529);
          pCVar12 = (Container *)operator_new(0x28);
          Container::Container(pCVar12,(TokenGroup *)local_4b0);
          boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::Container>
                    ((shared_ptr<markdown::Token> *)
                     &subgroup_1.
                      super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                      ._M_impl._M_node._M_size,pCVar12);
          std::
          vector<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
          ::push_back(replacements,
                      (value_type *)
                      &subgroup_1.
                       super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                       ._M_impl._M_node._M_size);
          boost::shared_ptr<markdown::Token>::~shared_ptr
                    ((shared_ptr<markdown::Token> *)
                     &subgroup_1.
                      super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                      ._M_impl._M_node._M_size);
          std::__cxx11::
          list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
          ::~list((list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                   *)local_4b0);
        }
        else {
          bVar2 = anon_unknown_0::looksLikeEmailAddress
                            ((string *)
                             &subgroup.
                              super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                              ._M_impl._M_node._M_size);
          if (bVar2) {
            std::__cxx11::
            list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
            ::list((list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                    *)local_558);
            pHVar10 = (HtmlAnchorTag *)operator_new(0x30);
            local_5c9 = 1;
            std::operator+(&local_5a8,"mailto:",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &subgroup.
                            super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                            ._M_impl._M_node._M_size);
            anon_unknown_0::emailEncode(&local_588,&local_5a8);
            std::__cxx11::string::string((string *)&local_5c8);
            HtmlAnchorTag::HtmlAnchorTag(pHVar10,&local_588,&local_5c8);
            local_5c9 = 0;
            boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlAnchorTag>
                      (&local_568,pHVar10);
            std::__cxx11::
            list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
            ::push_back((list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                         *)local_558,&local_568);
            boost::shared_ptr<markdown::Token>::~shared_ptr(&local_568);
            std::__cxx11::string::~string((string *)&local_5c8);
            std::__cxx11::string::~string((string *)&local_588);
            std::__cxx11::string::~string((string *)&local_5a8);
            pRVar9 = (RawText *)operator_new(0x30);
            local_601 = 1;
            anon_unknown_0::emailEncode
                      (&local_600,
                       (string *)
                       &subgroup.
                        super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                        ._M_impl._M_node._M_size);
            RawText(pRVar9,&local_600,false);
            local_601 = 0;
            boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::RawText>
                      (&local_5e0,pRVar9);
            std::__cxx11::
            list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
            ::push_back((list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                         *)local_558,&local_5e0);
            boost::shared_ptr<markdown::Token>::~shared_ptr(&local_5e0);
            std::__cxx11::string::~string((string *)&local_600);
            pHVar11 = (HtmlTag *)operator_new(0x30);
            local_63a = 1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_638,"/a",&local_639)
            ;
            HtmlTag::HtmlTag(pHVar11,&local_638);
            local_63a = 0;
            boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlTag>
                      (&local_618,pHVar11);
            std::__cxx11::
            list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
            ::push_back((list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                         *)local_558,&local_618);
            boost::shared_ptr<markdown::Token>::~shared_ptr(&local_618);
            std::__cxx11::string::~string((string *)&local_638);
            std::allocator<char>::~allocator(&local_639);
            pCVar12 = (Container *)operator_new(0x28);
            Container::Container(pCVar12,(TokenGroup *)local_558);
            boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::Container>
                      (&local_650,pCVar12);
            std::
            vector<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
            ::push_back(replacements,&local_650);
            boost::shared_ptr<markdown::Token>::~shared_ptr(&local_650);
            std::__cxx11::
            list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
            ::~list((list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                     *)local_558);
          }
          else {
            pvVar5 = boost::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)local_a0,8);
            boost::sub_match::operator_cast_to_string(&local_670,(sub_match *)pvVar5);
            sVar13 = isValidTag(&local_670,false);
            std::__cxx11::string::~string((string *)&local_670);
            if (sVar13 == 0) {
              pRVar9 = (RawText *)operator_new(0x30);
              local_6d9 = 1;
              pvVar5 = boost::
                       match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)local_a0,0);
              boost::sub_match::operator_cast_to_string(&local_6d8,(sub_match *)pvVar5);
              RawText(pRVar9,&local_6d8,true);
              local_6d9 = 0;
              boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::RawText>
                        (&local_6b8,pRVar9);
              std::
              vector<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
              ::push_back(replacements,&local_6b8);
              boost::shared_ptr<markdown::Token>::~shared_ptr(&local_6b8);
              std::__cxx11::string::~string((string *)&local_6d8);
            }
            else {
              pHVar11 = (HtmlTag *)operator_new(0x30);
              local_6a1 = 1;
              _restoreProcessedItems
                        (&local_6a0,
                         (string *)
                         &subgroup.
                          super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                          ._M_impl._M_node._M_size,replacements);
              HtmlTag::HtmlTag(pHVar11,&local_6a0);
              local_6a1 = 0;
              boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlTag>
                        (&local_680,pHVar11);
              std::
              vector<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
              ::push_back(replacements,&local_680);
              boost::shared_ptr<markdown::Token>::~shared_ptr(&local_680);
              std::__cxx11::string::~string((string *)&local_6a0);
            }
          }
        }
        std::__cxx11::string::~string
                  ((string *)
                   &subgroup.
                    super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                    ._M_impl._M_node._M_size);
      }
      local_718 = 0;
    }
    else {
      local_708._M_current = end._M_current;
      local_710._M_current = (char *)m._72_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::
      string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                (local_700,local_708,local_710,&local_711);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_700);
      std::__cxx11::string::~string(local_700);
      std::allocator<char>::~allocator(&local_711);
      local_718 = 3;
    }
    boost::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_a0);
    if (local_718 != 0) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::string RawText::_processLinksImagesAndTags(const std::string &src,
	ReplacementTable& replacements, const LinkIds& idTable)
{
	// NOTE: Kludge alert! The "inline link or image" regex should be...
	//
	//   "(?:(!?)\\[(.+?)\\] *\\((.*?)\\))"
	//
	// ...but that fails on the 'Images' test because it includes a "stupid URL"
	// that has parentheses within it. The proper way to deal with this would be
	// to match any nested parentheses, but regular expressions can't handle an
	// unknown number of nested items, so I'm cheating -- the regex for it
	// allows for one (and *only* one) pair of matched parentheses within the
	// URL. It makes the regex hard to follow (it was even harder to get right),
	// but it allows it to pass the test.
	//
	// The "reference link or image" one has a similar problem; it should be...
	//
	//   "|(?:(!?)\\[(.+?)\\](?: *\\[(.*?)\\])?)"
	//
	static const boost::regex cExpression(
		"(?:(!?)\\[([^\\]]+?)\\] *\\(([^\\(]*(?:\\(.*?\\).*?)*?)\\))" // Inline link or image
		"|(?:(!?)\\[((?:[^]]*?\\[.*?\\].*?)|(?:.+?))\\](?: *\\[(.*?)\\])?)" // Reference link or image
		"|(?:<(/?([a-zA-Z0-9]+).*?)>)" // potential HTML tag or auto-link
	);
	// Important captures: 1/4=image indicator, 2/5=contents/alttext,
	// 3=URL/title, 6=optional link ID, 7=potential HTML tag or auto-link
	// contents, 8=actual tag from 7.

	std::string tgt;
	std::string::const_iterator prev=src.begin(), end=src.end();
	while (1) {
		boost::smatch m;
		if (boost::regex_search(prev, end, m, cExpression)) {
			assert(m[0].matched);
			assert(m[0].length()!=0);

			tgt+=std::string(prev, m[0].first);
			tgt+="\x01@"+boost::lexical_cast<std::string>(replacements.size())+"@links&Images1\x01";
			prev=m[0].second;

			bool isImage=false, isLink=false, isReference=false;
			if (m[4].matched && m[4].length()) isImage=isReference=true;
			else if (m[1].matched && m[1].length()) isImage=true;
			else if (m[5].matched) isLink=isReference=true;
			else if (m[2].matched) isLink=true;

			if (isImage || isLink) {
				std::string contentsOrAlttext, url, title;
				bool resolved=false;
				if (isReference) {
					contentsOrAlttext=m[5];
					std::string linkId=(m[6].matched ? std::string(m[6]) : std::string());
					if (linkId.empty()) linkId=cleanTextLinkRef(contentsOrAlttext);

					optional<markdown::LinkIds::Target> target=idTable.find(linkId);
					if (target) { url=target->url; title=target->title; resolved=true; };
				} else {
					static const boost::regex cReference("^<?([^ >]*)>?(?: *(?:('|\")(.*)\\2)|(?:\\((.*)\\)))? *$");
					// Useful captures: 1=url, 3/4=title
					contentsOrAlttext=m[2];
					std::string urlAndTitle=m[3];
					boost::smatch mm;
					if (boost::regex_match(urlAndTitle, mm, cReference)) {
						url=mm[1];
						if (mm[3].matched) title=mm[3];
						else if (mm[4].matched) title=mm[4];
						resolved=true;
					}
				}

				if (!resolved) {
					// Just encode the first character as-is, and continue
					// searching after it.
					prev=m[0].first+1;
					replacements.push_back(TokenPtr(new RawText(std::string(m[0].first, prev))));
				} else if (isImage) {
					replacements.push_back(TokenPtr(new Image(contentsOrAlttext,
						url, title)));
				} else {
					replacements.push_back(TokenPtr(new HtmlAnchorTag(url, title)));
					tgt+=contentsOrAlttext;
					tgt+="\x01@"+boost::lexical_cast<std::string>(replacements.size())+"@links&Images2\x01";
					replacements.push_back(TokenPtr(new HtmlTag("/a")));
				}
			} else {
				// Otherwise it's an HTML tag or auto-link.
				std::string contents=m[7];

//				cerr << "Evaluating potential HTML or auto-link: " << contents << endl;
//				cerr << "m[8]=" << m[8] << endl;

				if (looksLikeUrl(contents)) {
					TokenGroup subgroup;
					subgroup.push_back(TokenPtr(new HtmlAnchorTag(contents)));
					subgroup.push_back(TokenPtr(new RawText(contents, false)));
					subgroup.push_back(TokenPtr(new HtmlTag("/a")));
					replacements.push_back(TokenPtr(new Container(subgroup)));
				} else if (looksLikeEmailAddress(contents)) {
					TokenGroup subgroup;
					subgroup.push_back(TokenPtr(new HtmlAnchorTag(emailEncode("mailto:"+contents))));
					subgroup.push_back(TokenPtr(new RawText(emailEncode(contents), false)));
					subgroup.push_back(TokenPtr(new HtmlTag("/a")));
					replacements.push_back(TokenPtr(new Container(subgroup)));
				} else if (isValidTag(m[8])) {
					replacements.push_back(TokenPtr(new HtmlTag(_restoreProcessedItems(contents, replacements))));
				} else {
					// Just encode it as-is
					replacements.push_back(TokenPtr(new RawText(m[0])));
				}
			}
		} else {
			tgt+=std::string(prev, end);
			break;
		}
	}
	return tgt;
}